

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O2

bool __thiscall pg::TSPMSolver::canlift(TSPMSolver *this,int node,int pl)

{
  int d;
  int iVar1;
  Game *pGVar2;
  int *a;
  int *b;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int *a_00;
  int *curedge;
  int *piVar9;
  
  lVar8 = (long)node;
  a_00 = this->pms + this->k * lVar8;
  if (a_00[pl] != -1) {
    d = ((this->super_Solver).game)->_priority[lVar8];
    iVar5 = Solver::owner(&this->super_Solver,node);
    pGVar2 = (this->super_Solver).game;
    piVar9 = pGVar2->_outedges + pGVar2->_firstouts[lVar8];
    if (iVar5 == pl) {
      do {
        uVar7 = (ulong)*piVar9;
        bVar4 = uVar7 != 0xffffffffffffffff;
        if (uVar7 == 0xffffffffffffffff) {
          return bVar4;
        }
        if ((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
          Prog(this,this->tmp,this->pms + uVar7 * this->k,d,pl);
          bVar3 = pm_less(this,a_00,this->tmp,d,pl);
          if (bVar3) {
            return bVar4;
          }
        }
        piVar9 = piVar9 + 1;
      } while( true );
    }
    iVar5 = -1;
    while( true ) {
      iVar1 = *piVar9;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) break;
      if ((((this->super_Solver).disabled)->_bits[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) == 0) {
        Prog(this,this->tmp,this->pms + this->k * uVar7,d,pl);
        a = this->tmp;
        b = this->best;
        if ((iVar5 == -1) || (bVar4 = pm_less(this,a,b,d,pl), bVar4)) {
          uVar7 = this->k;
          for (uVar6 = 0; iVar5 = iVar1, (~((long)uVar7 >> 0x3f) & uVar7) != uVar6;
              uVar6 = uVar6 + 1) {
            b[uVar6] = a[uVar6];
          }
        }
      }
      piVar9 = piVar9 + 1;
    }
    if (iVar5 != -1) {
      bVar4 = pm_less(this,a_00,this->best,d,pl);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool
TSPMSolver::canlift(int node, int pl)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top
    if (pm[pl] == -1) return false;

    const int d = priority(node);

    if (owner(node) == pl) {
        // do max
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (pm_less(pm, tmp, d, pl)) return true;
        }
        return false;
    } else {
        // do min
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl);
            if (best_to == -1 or pm_less(tmp, best, d, pl)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }
        if (best_to == -1) return false;
        return pm_less(pm, best, d, pl);
    }
}